

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_mesh.cpp
# Opt level: O1

void __thiscall ON_Mesh::SetSolidOrientation(ON_Mesh *this,int solid_orientation)

{
  char cVar1;
  
  if (solid_orientation == 1) {
    if (this->m_mesh_is_closed != '\x01') {
      this->m_mesh_is_closed = '\x01';
      this->m_mesh_is_manifold = '\0';
      this->m_mesh_is_oriented = '\0';
    }
    this->m_mesh_is_manifold = '\x01';
    this->m_mesh_is_oriented = '\x01';
    cVar1 = '\x01';
  }
  else if (solid_orientation == 0) {
    cVar1 = '\x03';
  }
  else if (solid_orientation == -1) {
    if (this->m_mesh_is_closed != '\x01') {
      this->m_mesh_is_closed = '\x01';
      this->m_mesh_is_manifold = '\0';
      this->m_mesh_is_oriented = '\0';
    }
    this->m_mesh_is_manifold = '\x01';
    this->m_mesh_is_oriented = '\x01';
    cVar1 = '\x02';
  }
  else {
    cVar1 = '\0';
  }
  this->m_mesh_is_solid = cVar1;
  return;
}

Assistant:

void ON_Mesh::SetSolidOrientation(int solid_orientation)
{
  switch(solid_orientation)
  {
  case -1: // closed oriented manifold solid with inward face normals
    SetClosed(1);
    m_mesh_is_manifold = 1;
    m_mesh_is_oriented = 1;
    m_mesh_is_solid = 2;
    break;

  case  0: // not solid
    m_mesh_is_solid = 3;
    // DO NOT SET m_mesh_is_closed here.
    // Meshes can be closed but not solid
    break;

  case  1: // closed oriented manifold solid with outward face normals
    SetClosed(1);
    m_mesh_is_manifold = 1;
    m_mesh_is_oriented = 1;
    m_mesh_is_solid = 1;
    break;

  default:
    m_mesh_is_solid = 0;
    break;
  }
}